

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall TestValueTestcompareString::runTestCase(TestValueTestcompareString *this)

{
  TestResult *pTVar1;
  Value local_a0;
  Value local_78;
  PredicateContext local_50;
  
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_50.id_ = pTVar1->predicateId_;
  local_50.file_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_50.line_ = 0x538;
  local_50.expr_ = "checkIsLess(\"\", \" \")";
  local_50.next_ = (PredicateContext *)0x0;
  local_50.failure_ = (Failure *)0x0;
  pTVar1->predicateStackTail_->next_ = &local_50;
  pTVar1->predicateId_ = local_50.id_ + 1;
  pTVar1->predicateStackTail_ = &local_50;
  Json::Value::Value(&local_78,"");
  Json::Value::Value(&local_a0," ");
  ValueTest::checkIsLess(&this->super_ValueTest,&local_78,&local_a0);
  Json::Value::~Value(&local_a0);
  Json::Value::~Value(&local_78);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_50.id_ = pTVar1->predicateId_;
  local_50.file_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_50.line_ = 0x539;
  local_50.expr_ = "checkIsLess(\"\", \"a\")";
  local_50.next_ = (PredicateContext *)0x0;
  local_50.failure_ = (Failure *)0x0;
  pTVar1->predicateStackTail_->next_ = &local_50;
  pTVar1->predicateId_ = local_50.id_ + 1;
  pTVar1->predicateStackTail_ = &local_50;
  Json::Value::Value(&local_78,"");
  Json::Value::Value(&local_a0,"a");
  ValueTest::checkIsLess(&this->super_ValueTest,&local_78,&local_a0);
  Json::Value::~Value(&local_a0);
  Json::Value::~Value(&local_78);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_50.id_ = pTVar1->predicateId_;
  local_50.file_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_50.line_ = 0x53a;
  local_50.expr_ = "checkIsLess(\"abcd\", \"zyui\")";
  local_50.next_ = (PredicateContext *)0x0;
  local_50.failure_ = (Failure *)0x0;
  pTVar1->predicateStackTail_->next_ = &local_50;
  pTVar1->predicateId_ = local_50.id_ + 1;
  pTVar1->predicateStackTail_ = &local_50;
  Json::Value::Value(&local_78,"abcd");
  Json::Value::Value(&local_a0,"zyui");
  ValueTest::checkIsLess(&this->super_ValueTest,&local_78,&local_a0);
  Json::Value::~Value(&local_a0);
  Json::Value::~Value(&local_78);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_50.id_ = pTVar1->predicateId_;
  local_50.file_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_50.line_ = 0x53b;
  local_50.expr_ = "checkIsLess(\"abc\", \"abcd\")";
  local_50.next_ = (PredicateContext *)0x0;
  local_50.failure_ = (Failure *)0x0;
  pTVar1->predicateStackTail_->next_ = &local_50;
  pTVar1->predicateId_ = local_50.id_ + 1;
  pTVar1->predicateStackTail_ = &local_50;
  Json::Value::Value(&local_78,"abc");
  Json::Value::Value(&local_a0,"abcd");
  ValueTest::checkIsLess(&this->super_ValueTest,&local_78,&local_a0);
  Json::Value::~Value(&local_a0);
  Json::Value::~Value(&local_78);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_50.id_ = pTVar1->predicateId_;
  local_50.file_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_50.line_ = 0x53c;
  local_50.expr_ = "checkIsEqual(\"abcd\", \"abcd\")";
  local_50.next_ = (PredicateContext *)0x0;
  local_50.failure_ = (Failure *)0x0;
  pTVar1->predicateStackTail_->next_ = &local_50;
  pTVar1->predicateId_ = local_50.id_ + 1;
  pTVar1->predicateStackTail_ = &local_50;
  Json::Value::Value(&local_78,"abcd");
  Json::Value::Value(&local_a0,"abcd");
  ValueTest::checkIsEqual(&this->super_ValueTest,&local_78,&local_a0);
  Json::Value::~Value(&local_a0);
  Json::Value::~Value(&local_78);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_50.id_ = pTVar1->predicateId_;
  local_50.file_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_50.line_ = 0x53d;
  local_50.expr_ = "checkIsEqual(\" \", \" \")";
  local_50.next_ = (PredicateContext *)0x0;
  local_50.failure_ = (Failure *)0x0;
  pTVar1->predicateStackTail_->next_ = &local_50;
  pTVar1->predicateId_ = local_50.id_ + 1;
  pTVar1->predicateStackTail_ = &local_50;
  Json::Value::Value(&local_78," ");
  Json::Value::Value(&local_a0," ");
  ValueTest::checkIsEqual(&this->super_ValueTest,&local_78,&local_a0);
  Json::Value::~Value(&local_a0);
  Json::Value::~Value(&local_78);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_50.id_ = pTVar1->predicateId_;
  local_50.file_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_50.line_ = 0x53e;
  local_50.expr_ = "checkIsLess(\"ABCD\", \"abcd\")";
  local_50.next_ = (PredicateContext *)0x0;
  local_50.failure_ = (Failure *)0x0;
  pTVar1->predicateStackTail_->next_ = &local_50;
  pTVar1->predicateId_ = local_50.id_ + 1;
  pTVar1->predicateStackTail_ = &local_50;
  Json::Value::Value(&local_78,"ABCD");
  Json::Value::Value(&local_a0,"abcd");
  ValueTest::checkIsLess(&this->super_ValueTest,&local_78,&local_a0);
  Json::Value::~Value(&local_a0);
  Json::Value::~Value(&local_78);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_50.id_ = pTVar1->predicateId_;
  local_50.file_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_50.line_ = 0x53f;
  local_50.expr_ = "checkIsEqual(\"ABCD\", \"ABCD\")";
  local_50.next_ = (PredicateContext *)0x0;
  local_50.failure_ = (Failure *)0x0;
  pTVar1->predicateStackTail_->next_ = &local_50;
  pTVar1->predicateId_ = local_50.id_ + 1;
  pTVar1->predicateStackTail_ = &local_50;
  Json::Value::Value(&local_78,"ABCD");
  Json::Value::Value(&local_a0,"ABCD");
  ValueTest::checkIsEqual(&this->super_ValueTest,&local_78,&local_a0);
  Json::Value::~Value(&local_a0);
  Json::Value::~Value(&local_78);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  return;
}

Assistant:

JSONTEST_FIXTURE(ValueTest, compareString) {
  JSONTEST_ASSERT_PRED(checkIsLess("", " "));
  JSONTEST_ASSERT_PRED(checkIsLess("", "a"));
  JSONTEST_ASSERT_PRED(checkIsLess("abcd", "zyui"));
  JSONTEST_ASSERT_PRED(checkIsLess("abc", "abcd"));
  JSONTEST_ASSERT_PRED(checkIsEqual("abcd", "abcd"));
  JSONTEST_ASSERT_PRED(checkIsEqual(" ", " "));
  JSONTEST_ASSERT_PRED(checkIsLess("ABCD", "abcd"));
  JSONTEST_ASSERT_PRED(checkIsEqual("ABCD", "ABCD"));
}